

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O0

optional<QStringConverter::Encoding> QStringConverter::encodingForHtml(QByteArrayView data)

{
  long lVar1;
  QAnyStringView name;
  bool bVar2;
  _Optional_payload_base<QStringConverter::Encoding> _Var3;
  size_t in_RSI;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_RDI;
  long in_FS_OFFSET;
  QByteArrayView in_stack_00000010;
  QByteArray encodingTag;
  optional<QStringConverter::Encoding> encoding;
  undefined1 in_stack_000000d0 [16];
  Encoding *in_stack_ffffffffffffff78;
  optional<QStringConverter::Encoding> *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  QAnyStringView *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffffc0;
  _Optional_payload_base<QStringConverter::Encoding> local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _Var3 = (_Optional_payload_base<QStringConverter::Encoding>)
          encodingForData(in_stack_00000010,(char16_t)((ulong)in_stack_ffffffffffffffc0 >> 0x30));
  bVar2 = std::optional::operator_cast_to_bool((optional<QStringConverter::Encoding> *)0x545236);
  if (!bVar2) {
    parseHtmlMetaForEncoding((QByteArrayView)in_stack_000000d0);
    bVar2 = QByteArray::isEmpty((QByteArray *)0x5452a1);
    if (bVar2) {
      std::optional<QStringConverter::Encoding>::optional<QStringConverter::Encoding,_true>
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    else {
      QAnyStringView::QAnyStringView
                (in_stack_ffffffffffffff90,
                 (QByteArray *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      name.m_size = in_RSI;
      name.field_0.m_data = in_RDI.m_data;
      local_10 = (_Optional_payload_base<QStringConverter::Encoding>)encodingForName(name);
    }
    QByteArray::~QByteArray((QByteArray *)0x5452fb);
    _Var3 = local_10;
  }
  local_10 = _Var3;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (optional<QStringConverter::Encoding>)local_10;
}

Assistant:

std::optional<QStringConverter::Encoding> QStringConverter::encodingForHtml(QByteArrayView data)
{
    // determine charset
    std::optional<QStringConverter::Encoding> encoding = encodingForData(data);
    if (encoding)
        // trust the initial BOM
        return encoding;

    QByteArray encodingTag = parseHtmlMetaForEncoding(data);
    if (!encodingTag.isEmpty())
        return encodingForName(encodingTag);

    return Utf8;
}